

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O1

EdwardsCurve * ecurve(void)

{
  mp_int *p;
  mp_int *d;
  mp_int *a;
  mp_int *nonsquare_mod_p;
  EdwardsCurve *pEVar1;
  
  p = mp_from_hex("fce2dac1704095de0b5c48876c45063cd475");
  d = mp_from_hex("bd4f77401c3b14ae1742a7d1d367adac8f3e");
  a = mp_from_hex("51d0845da3fa871aaac4341adea53b861919");
  nonsquare_mod_p = mp_from_integer(2);
  pEVar1 = ecc_edwards_curve(p,d,a,nonsquare_mod_p);
  mp_free(p);
  mp_free(d);
  mp_free(a);
  mp_free(nonsquare_mod_p);
  return pEVar1;
}

Assistant:

static EdwardsCurve *ecurve(void)
{
    mp_int *p = MP_LITERAL(0xfce2dac1704095de0b5c48876c45063cd475);
    mp_int *d = MP_LITERAL(0xbd4f77401c3b14ae1742a7d1d367adac8f3e);
    mp_int *a = MP_LITERAL(0x51d0845da3fa871aaac4341adea53b861919);
    mp_int *nonsquare = mp_from_integer(2);
    EdwardsCurve *ec = ecc_edwards_curve(p, d, a, nonsquare);
    mp_free(p);
    mp_free(d);
    mp_free(a);
    mp_free(nonsquare);
    return ec;
}